

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

void __thiscall NEST::NESTcalc::NESTcalc(NESTcalc *this,VDetector *detector)

{
  this->_vptr_NESTcalc = (_func_int **)&PTR__NESTcalc_0011cc10;
  std::ofstream::ofstream(&this->pulseFile);
  (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newSpike).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scintillation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scintillation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->photon_areas).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scintillation).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->photon_areas).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->photon_areas).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (detector != (VDetector *)0x0) {
    this->fdetector = detector;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve(&this->photon_areas,2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&this->photon_areas,2);
    std::vector<double,_std::allocator<double>_>::resize(&this->scintillation,9);
    std::vector<double,_std::allocator<double>_>::resize(&this->newSpike,2);
    std::vector<double,_std::allocator<double>_>::resize(&this->ionization,9);
    return;
  }
  __assert_fail("detector",
                "/workspace/llm4binary/github/license_c_cmakelists/NESTCollaboration[P]nest/src/NEST.cpp"
                ,0x48b,"NEST::NESTcalc::NESTcalc(VDetector *)");
}

Assistant:

NESTcalc::NESTcalc(VDetector *detector) {
  assert(detector);
  fdetector = detector;

  photon_areas.reserve(2);
  photon_areas.resize(2);
  scintillation.resize(9);
  newSpike.resize(2);
  ionization.resize(9);
}